

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueConverter.hpp
# Opt level: O0

SmallBuffer *
helics::ValueConverter<std::basic_string_view<char,_std::char_traits<char>_>_>::convert
          (basic_string_view<char,_std::char_traits<char>_> *val)

{
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  SmallBuffer *in_RDI;
  SmallBuffer *dv;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar1;
  
  uVar1 = 0;
  SmallBuffer::SmallBuffer(in_RDI);
  convert(in_RSI,(SmallBuffer *)CONCAT17(uVar1,in_stack_ffffffffffffffe8));
  return in_RDI;
}

Assistant:

static SmallBuffer convert(const X& val)
    {
        auto dv = SmallBuffer();
        convert(val, dv);
        return dv;
    }